

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::sized_declarations_invalid_sizes4<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (sized_declarations_invalid_sizes4<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string *local_1d0;
  string local_128 [8];
  string shader_source;
  size_t string_index;
  allocator<char> local_f8;
  allocator<char> local_f7;
  allocator<char> local_f6;
  allocator<char> local_f5 [20];
  allocator<char> local_e1;
  string *local_e0;
  string local_d8 [8];
  string input [6];
  TestShaderType tested_shader_type_local;
  sized_declarations_invalid_sizes4<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  string_index._6_1_ = 1;
  local_e0 = local_d8;
  input[5].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"    float x[2,2][2][2];\n",&local_e1)
  ;
  local_e0 = (string *)(input[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[0].field_2._M_local_buf + 8),"    float x[2][2,2][2];\n",local_f5);
  local_e0 = (string *)(input[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[1].field_2._M_local_buf + 8),"    float x[2][2][2,2];\n",&local_f6);
  local_e0 = (string *)(input[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[2].field_2._M_local_buf + 8),"    float x[2,2,2][2];\n",&local_f7);
  local_e0 = (string *)(input[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[3].field_2._M_local_buf + 8),"    float x[2][2,2,2];\n",&local_f8);
  local_e0 = (string *)(input[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[4].field_2._M_local_buf + 8),"    float x[2,2,2,2];\n",
             (allocator<char> *)((long)&string_index + 7));
  string_index._6_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 7));
  std::allocator<char>::~allocator(&local_f8);
  std::allocator<char>::~allocator(&local_f7);
  std::allocator<char>::~allocator(&local_f6);
  std::allocator<char>::~allocator(local_f5);
  std::allocator<char>::~allocator(&local_e1);
  for (shader_source.field_2._8_8_ = 0; (ulong)shader_source.field_2._8_8_ < 6;
      shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
    std::__cxx11::string::string(local_128);
    std::__cxx11::string::operator+=(local_128,(string *)shader_start_abi_cxx11_);
    std::__cxx11::string::operator+=
              (local_128,
               (string *)(input[shader_source.field_2._8_8_ + -1].field_2._M_local_buf + 8));
    switch(input[5].field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=(local_128,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=(local_128,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=(local_128,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x774);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=(local_128,(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)(uint)input[5].field_2._12_4_,local_128);
    std::__cxx11::string::~string(local_128);
  }
  local_1d0 = (string *)(input[5].field_2._M_local_buf + 8);
  do {
    local_1d0 = local_1d0 + -0x20;
    std::__cxx11::string::~string(local_1d0);
  } while (local_1d0 != local_d8);
  return;
}

Assistant:

void sized_declarations_invalid_sizes4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string input[] = { "    float x[2,2][2][2];\n", "    float x[2][2,2][2];\n", "    float x[2][2][2,2];\n",
							"    float x[2,2,2][2];\n",  "    float x[2][2,2,2];\n",  "    float x[2,2,2,2];\n" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source;

		shader_source += shader_start;
		shader_source += input[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int string_index = 0; ...) */
}